

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant.hpp
# Opt level: O1

rt_expression_interface<double> * __thiscall
viennamath::rt_constant<long,_viennamath::rt_expression_interface<double>_>::substitute
          (rt_constant<long,_viennamath::rt_expression_interface<double>_> *this,
          vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
          *e,vector<const_viennamath::rt_expression_interface<double>_*,_std::allocator<const_viennamath::rt_expression_interface<double>_*>_>
             *repl)

{
  ulong uVar1;
  int iVar2;
  rt_expression_interface<double> *prVar3;
  undefined4 extraout_var;
  ulong uVar4;
  bool bVar5;
  
  prVar3 = *(rt_expression_interface<double> **)e;
  bVar5 = *(rt_expression_interface<double> **)(e + 8) != prVar3;
  if (bVar5) {
    iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                      (this,prVar3->_vptr_rt_expression_interface);
    if ((char)iVar2 == '\0') {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        prVar3 = *(rt_expression_interface<double> **)e;
        bVar5 = uVar4 < (ulong)(*(long *)(e + 8) - (long)prVar3 >> 3);
        if (!bVar5) goto LAB_0010e8aa;
        iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                          (this,prVar3[uVar4]._vptr_rt_expression_interface);
        uVar1 = uVar4 + 1;
      } while ((char)iVar2 == '\0');
    }
    else {
      uVar4 = 0;
    }
    prVar3 = (rt_expression_interface<double> *)
             (**(code **)(**(long **)(*(long *)repl + uVar4 * 8) + 0x10))();
  }
LAB_0010e8aa:
  if (!bVar5) {
    iVar2 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[2])(this);
    return (rt_expression_interface<double> *)CONCAT44(extraout_var,iVar2);
  }
  return prVar3;
}

Assistant:

InterfaceType * substitute(std::vector<const InterfaceType *> const &  e,
                                 std::vector<const InterfaceType *> const &  repl) const
      {
        //std::cout << "Comparing variable<" << id << "> with " << e->str() << ", result: ";
        for (size_t i=0; i<e.size(); ++i)
          if (deep_equal(e[i]))
            return repl[i]->clone();

        //std::cout << "FALSE" << std::endl;
        return clone();
      }